

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O0

void __thiscall
RandomForest::ORForest<double>::Train
          (ORForest<double> *this,double *i_trainData,int i_Ns,int i_Nfp1)

{
  value_type vVar1;
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  *this_00;
  element_type *peVar2;
  vector<double,_std::allocator<double>_> *this_01;
  element_type *peVar3;
  reference pvVar4;
  reference this_02;
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_68;
  int local_54;
  undefined1 local_50 [4];
  int j;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> tempSample;
  int i;
  undefined1 local_30 [8];
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  tempTrainData;
  int i_Nfp1_local;
  int i_Ns_local;
  double *i_trainData_local;
  ORForest<double> *this_local;
  
  tempTrainData.
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = i_Nfp1;
  tempTrainData.
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = i_Ns;
  this_00 = (vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
             *)operator_new(0x18);
  std::
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(this_00);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>>
  ::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>,void>
            ((shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>>
              *)local_30,this_00);
  peVar2 = std::
           __shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  ::resize(peVar2,(long)tempTrainData.
                        super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_);
  for (tempSample.
       super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._0_4_ = 0;
      (int)tempSample.
           super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi <
      tempTrainData.
      super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_;
      tempSample.
      super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ =
           (int)tempSample.
                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1) {
    this_01 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    std::vector<double,_std::allocator<double>_>::vector(this_01);
    std::shared_ptr<std::vector<double,std::allocator<double>>>::
    shared_ptr<std::vector<double,std::allocator<double>>,void>
              ((shared_ptr<std::vector<double,std::allocator<double>>> *)local_50,this_01);
    peVar3 = std::
             __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    std::vector<double,_std::allocator<double>_>::resize
              (peVar3,(long)(int)tempTrainData.
                                 super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
    for (local_54 = 0;
        local_54 <
        (int)tempTrainData.
             super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi; local_54 = local_54 + 1) {
      vVar1 = i_trainData
              [(long)((int)tempSample.
                           super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi *
                     (int)tempTrainData.
                          super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi) + (long)local_54];
      peVar3 = std::
               __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      pvVar4 = std::vector<double,_std::allocator<double>_>::at(peVar3,(long)local_54);
      *pvVar4 = vVar1;
    }
    peVar2 = std::
             __shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    this_02 = std::
              vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
              ::at(peVar2,(long)(int)tempSample.
                                     super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::operator=
              (this_02,(shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_50);
    std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::~shared_ptr
              ((shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_50);
  }
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::shared_ptr(&local_68,
               (shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
                *)local_30);
  Train(this,&local_68);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~shared_ptr(&local_68);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 *)local_30);
  return;
}

Assistant:

void RandomForest::ORForest<T>::Train(const T *i_trainData, int i_Ns, int i_Nfp1)
{
    std::shared_ptr<std::vector<std::shared_ptr<std::vector<T> > > > tempTrainData(new std::vector<std::shared_ptr<std::vector<T> > >);
    tempTrainData->resize(i_Ns);
    for (int i=0; i<i_Ns; i++)
    {
        std::shared_ptr<std::vector<T> > tempSample(new std::vector<T>);
        tempSample->resize(i_Nfp1);
        for (int j=0; j<i_Nfp1; j++)
        {
            tempSample->at(j)=*(i_trainData+i*i_Nfp1+j);
        }
        tempTrainData->at(i)=tempSample;
    }
    Train(tempTrainData);
}